

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodebuilder.cpp
# Opt level: O0

void __thiscall
YAML::NodeBuilder::OnSequenceStart
          (NodeBuilder *this,Mark *mark,string *tag,anchor_t anchor,value style)

{
  node *this_00;
  NodeBuilder *in_RCX;
  undefined4 in_R8D;
  node *node;
  undefined4 in_stack_ffffffffffffffc8;
  value in_stack_ffffffffffffffcc;
  anchor_t in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  
  this_00 = Push(in_RCX,(Mark *)CONCAT44(in_R8D,in_stack_ffffffffffffffd8),in_stack_ffffffffffffffd0
                );
  detail::node::set_tag
            (this_00,(string *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  detail::node::set_type(this_00,in_stack_ffffffffffffffcc);
  detail::node::set_style(this_00,in_stack_ffffffffffffffcc);
  return;
}

Assistant:

void NodeBuilder::OnSequenceStart(const Mark& mark, const std::string& tag,
                                  anchor_t anchor, EmitterStyle::value style) {
  detail::node& node = Push(mark, anchor);
  node.set_tag(tag);
  node.set_type(NodeType::Sequence);
  node.set_style(style);
}